

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utObjImportExport.cpp
# Opt level: O2

void __thiscall
utObjImportExport_obj_import_test_Test::TestBody(utObjImportExport_obj_import_test_Test *this)

{
  aiMesh **ppaVar1;
  aiMesh *this_00;
  aiScene *expected;
  char *in_R9;
  uint i;
  char *message;
  ulong uVar2;
  AssertHelper AStack_88;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  AssertionResult gtest_ar_;
  SceneDiffer differ;
  AssertionResult gtest_ar;
  aiScene *scene;
  
  message = "";
  scene = Assimp::Importer::ReadFileFromMemory
                    ((this->super_utObjImportExport).m_im,
                     "o 1\n\n# Vertex list\n\nv -0.5 -0.5  0.5\nv -0.5 -0.5 -0.5\nv -0.5  0.5 -0.5\nv -0.5  0.5  0.5\nv  0.5 -0.5  0.5\nv  0.5 -0.5 -0.5\nv  0.5  0.5 -0.5\nv  0.5  0.5  0.5\n\n# Point / Line / Face list\n\ng Box01\nusemtl Default\nf 4 3 2 1\nf 2 6 5 1\nf 3 7 6 2\nf 8 7 3 4\nf 5 8 4 1\nf 6 7 8 5\n\n# End of file\n"
                     ,0x11b,0,"");
  expected = utObjImportExport::createScene(&this->super_utObjImportExport);
  differ.m_diffs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)&gtest_ar,"nullptr","scene",(void **)&differ,&scene);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&differ);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0xec,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&differ);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&differ);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  Assimp::SceneDiffer::SceneDiffer(&differ);
  gtest_ar_.success_ = Assimp::SceneDiffer::isEqual(&differ,expected,scene);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"differ.isEqual( expected, scene )","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0xef,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&AStack_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&AStack_88);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  Assimp::SceneDiffer::showReport(&differ);
  Assimp::Importer::FreeScene((this->super_utObjImportExport).m_im);
  for (uVar2 = 0; ppaVar1 = expected->mMeshes, uVar2 < expected->mNumMeshes; uVar2 = uVar2 + 1) {
    this_00 = ppaVar1[uVar2];
    if (this_00 != (aiMesh *)0x0) {
      aiMesh::~aiMesh(this_00);
    }
    operator_delete(this_00);
  }
  if (ppaVar1 != (aiMesh **)0x0) {
    operator_delete__(ppaVar1);
  }
  expected->mMeshes = (aiMesh **)0x0;
  if (expected->mMaterials != (aiMaterial **)0x0) {
    operator_delete__(expected->mMaterials);
  }
  expected->mMaterials = (aiMaterial **)0x0;
  aiScene::~aiScene(expected);
  operator_delete(expected);
  Assimp::SceneDiffer::~SceneDiffer(&differ);
  return;
}

Assistant:

TEST_F( utObjImportExport, obj_import_test ) {
    const aiScene *scene = m_im->ReadFileFromMemory( (void*) ObjModel, strlen(ObjModel), 0 );
    aiScene *expected = createScene();
    EXPECT_NE( nullptr, scene );

    SceneDiffer differ;
    EXPECT_TRUE( differ.isEqual( expected, scene ) );
    differ.showReport();

    m_im->FreeScene();
    for(unsigned int i = 0; i < expected->mNumMeshes; ++i)
    {
        delete expected->mMeshes[i];
    }
    delete[] expected->mMeshes;
    expected->mMeshes = nullptr;
    delete[] expected->mMaterials;
    expected->mMaterials = nullptr;
    delete expected;
}